

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::suffix_array(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
               *this,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     begin,
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              end,comm *_comm)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  runtime_error *this_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  custom_op<unsigned_long,_true> op;
  ulong local_68;
  custom_op<unsigned_long,_true> local_60;
  
  this->_vptr_suffix_array = (_func_int **)&PTR__suffix_array_001aa0b0;
  mxx::comm::copy(&this->comm,(EVP_PKEY_CTX *)_comm,(EVP_PKEY_CTX *)end._M_current);
  this->p = (this->comm).m_size;
  (this->input_begin)._M_current = begin._M_current;
  (this->input_end)._M_current = end._M_current;
  (this->part)._vptr_block_decomposition_buffered =
       (_func_int **)&PTR__block_decomposition_buffered_001aa0e0;
  (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_SA).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->local_LCP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->local_LCP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->local_LCP).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->local_size = (long)end._M_current - (long)begin._M_current;
  mxx::custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long,true> *)&local_60);
  MPI_Allreduce(&this->local_size,&local_68,1,local_60.m_type_copy,local_60.m_op,
                (this->comm).mpi_comm);
  mxx::custom_op<unsigned_long,_true>::~custom_op(&local_60);
  this->n = local_68;
  uVar1 = (this->comm).m_size;
  uVar2 = (this->comm).m_rank;
  uVar4 = (uint)((local_68 & 0xffffffff) % (ulong)uVar1);
  uVar6 = uVar2;
  if (uVar4 < uVar2) {
    uVar6 = uVar4;
  }
  uVar3 = (uint)((local_68 & 0xffffffff) / (ulong)uVar1);
  uVar5 = (uVar2 < uVar4) + uVar3;
  (this->part).n = (uint)local_68;
  (this->part).p = uVar1;
  (this->part).rank = uVar2;
  (this->part).div = uVar3;
  (this->part).mod = uVar4;
  (this->part).loc_size = uVar5;
  (this->part).prefix = uVar3 * uVar2 + uVar6;
  (this->part).div1mod = (uVar3 + 1) * uVar4;
  if (this->local_size == (ulong)uVar5) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"The input string must be equally block decomposed accross all MPI processes.")
  ;
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

suffix_array(InputIterator begin, InputIterator end, const mxx::comm& _comm)
        : comm(_comm.copy()), p(comm.size()),
        input_begin(begin), input_end(end)
    {
        // the local size of the input
        local_size = std::distance(begin, end);
        n = mxx::allreduce(local_size, this->comm);
        // get distribution
        part = mxx::partition::block_decomposition_buffered<index_t>(n, comm.size(), comm.rank());

        // assert a block decomposition
        if (part.local_size() != local_size)
            throw std::runtime_error("The input string must be equally block decomposed accross all MPI processes.");

        // get MPI type
        //mpi_index_t = index_mpi_dt.type();
    }